

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

void Bmcg_ManAddCnf(Bmcg_Man_t *p,bmcg_sat_solver *pSat,Cnf_Dat_t *pCnf)

{
  int *plits;
  int iVar1;
  abctime aVar2;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  Gia_Man_t *p_00;
  
  aVar2 = Abc_Clock();
  bmcg_sat_solver_set_nvars(pSat,p->nSatVars);
  if (p->pPars->fUseEliminate != 0) {
    iVar7 = p->nOldFrPis;
    while( true ) {
      p_00 = p->pFrames;
      iVar1 = p_00->nRegs;
      if (p_00->vCis->nSize - iVar1 <= iVar7) break;
      pGVar3 = Gia_ManCi(p_00,iVar7);
      iVar1 = Gia_ObjId(p->pFrames,pGVar3);
      iVar1 = Vec_IntEntry(&p->vFr2Sat,iVar1);
      if (0 < iVar1) {
        bmcg_sat_solver_var_set_frozen(pSat,iVar1,1);
      }
      iVar7 = iVar7 + 1;
    }
    for (iVar7 = p->nOldFrPos; iVar5 = p_00->vCos->nSize - iVar1, iVar7 < iVar5; iVar7 = iVar7 + 1)
    {
      pGVar3 = Gia_ManCo(p_00,iVar7);
      iVar1 = Gia_ObjId(p->pFrames,pGVar3);
      iVar1 = Vec_IntEntry(&p->vFr2Sat,iVar1);
      if (0 < iVar1) {
        bmcg_sat_solver_var_set_frozen(pSat,iVar1,1);
      }
      p_00 = p->pFrames;
      iVar1 = p_00->nRegs;
    }
    p->nOldFrPis = p_00->vCis->nSize - iVar1;
    p->nOldFrPos = iVar5;
  }
  lVar6 = 0;
  do {
    if (pCnf->nClauses <= lVar6) {
      if (p->pPars->fUseEliminate != 0) {
        bmcg_sat_solver_eliminate(pSat,0);
        for (iVar7 = 0; iVar7 < (p->vFr2Sat).nSize; iVar7 = iVar7 + 1) {
          iVar1 = Vec_IntEntry(&p->vFr2Sat,iVar7);
          if (0 < iVar1) {
            iVar1 = bmcg_sat_solver_var_is_elim(pSat,iVar1);
            if (iVar1 != 0) {
              Vec_IntWriteEntry(&p->vFr2Sat,iVar7,-1);
            }
          }
        }
        aVar4 = Abc_Clock();
        p->timeSmp = p->timeSmp + (aVar4 - aVar2);
      }
      return;
    }
    plits = pCnf->pClauses[lVar6];
    iVar7 = bmcg_sat_solver_addclause
                      (pSat,plits,(int)((ulong)((long)pCnf->pClauses[lVar6 + 1] - (long)plits) >> 2)
                      );
    lVar6 = lVar6 + 1;
  } while (iVar7 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                ,0x15c,"void Bmcg_ManAddCnf(Bmcg_Man_t *, bmcg_sat_solver *, Cnf_Dat_t *)");
}

Assistant:

void Bmcg_ManAddCnf( Bmcg_Man_t * p, bmcg_sat_solver * pSat, Cnf_Dat_t * pCnf )
{
    int i, iSatVar;
    abctime clk = Abc_Clock();
    bmcg_sat_solver_set_nvars( pSat, p->nSatVars );
    if ( p->pPars->fUseEliminate )
    {
        for ( i = p->nOldFrPis; i < Gia_ManPiNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPi( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        for ( i = p->nOldFrPos; i < Gia_ManPoNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPo( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        p->nOldFrPis = Gia_ManPiNum(p->pFrames);
        p->nOldFrPos = Gia_ManPoNum(p->pFrames);
    }
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !bmcg_sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    if ( !p->pPars->fUseEliminate )
        return;
    bmcg_sat_solver_eliminate( pSat, 0 );
    Vec_IntForEachEntry( &p->vFr2Sat, iSatVar, i )
        if ( iSatVar > 0 && bmcg_sat_solver_var_is_elim(pSat, iSatVar) )
            Vec_IntWriteEntry( &p->vFr2Sat, i, -1 );
    p->timeSmp += Abc_Clock() - clk;
}